

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O3

void __thiscall google::protobuf::UnknownFieldSet::ClearFallback(UnknownFieldSet *this)

{
  LogMessage *other;
  pointer pUVar1;
  pointer pUVar2;
  long lVar3;
  long lVar4;
  LogMessage local_60;
  LogFinisher local_21;
  
  pUVar2 = (this->fields_).
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pUVar1 = (this->fields_).
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pUVar2 == pUVar1) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/unknown_field_set.cc"
               ,0x3a);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: !fields_.empty(): ");
    internal::LogFinisher::operator=(&local_21,other);
    internal::LogMessage::~LogMessage(&local_60);
    pUVar2 = (this->fields_).
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pUVar1 = (this->fields_).
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  lVar3 = (long)(int)((ulong)((long)pUVar1 - (long)pUVar2) >> 4);
  lVar4 = lVar3 + 1;
  lVar3 = lVar3 << 4;
  do {
    UnknownField::Delete
              ((UnknownField *)
               ((long)&(this->fields_).
                       super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                       ._M_impl.super__Vector_impl_data._M_start[-1].number_ + lVar3));
    lVar4 = lVar4 + -1;
    lVar3 = lVar3 + -0x10;
  } while (1 < lVar4);
  pUVar2 = (this->fields_).
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_finish != pUVar2) {
    (this->fields_).
    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
    ._M_impl.super__Vector_impl_data._M_finish = pUVar2;
  }
  return;
}

Assistant:

void UnknownFieldSet::ClearFallback() {
  GOOGLE_DCHECK(!fields_.empty());
  int n = fields_.size();
  do {
    (fields_)[--n].Delete();
  } while (n > 0);
  fields_.clear();
}